

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O2

string * __thiscall
DebugStream::timestamp_abi_cxx11_(string *__return_storage_ptr__,DebugStream *this,uint64_t t)

{
  string local_40;
  
  std::__cxx11::to_string(__return_storage_ptr__,(ulong)this / 1000000);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_40,((ulong)this / 1000) % 1000);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_40,(ulong)this % 1000);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string timestamp(const uint64_t t)
    {
        uint64_t us = t % 1000;
        uint64_t ms = t / 1000;
        uint64_t s = ms / 1000;
        ms = ms % 1000;
        std::string _s = std::to_string(s);
        _s += "s:";
        _s += std::to_string(ms);
        _s += "ms:";
        _s += std::to_string(us);
        _s += "us";
        return _s;
    }